

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.h
# Opt level: O3

bool __thiscall spv::Builder::isBoolType(Builder *this,Id typeId)

{
  mapped_type *pmVar1;
  bool bVar2;
  key_type local_18 [2];
  
  local_18[1] = 0x14;
  pmVar1 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->groupedTypes,local_18 + 1);
  if ((pmVar1->super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (pmVar1->super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    bVar2 = false;
  }
  else {
    local_18[0] = 0x14;
    pmVar1 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->groupedTypes,local_18);
    bVar2 = (pmVar1->super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>).
            _M_impl.super__Vector_impl_data._M_finish[-1]->resultId == typeId;
  }
  return bVar2;
}

Assistant:

bool isBoolType(Id typeId)
        { return groupedTypes[OpTypeBool].size() > 0 && typeId == groupedTypes[OpTypeBool].back()->getResultId(); }